

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

size_t release_unused_segments(mstate m)

{
  void *__addr;
  size_t __len;
  malloc_segment *pmVar1;
  malloc_tree_chunk *pmVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  tbinptr pmVar7;
  ulong uVar8;
  malloc_tree_chunk *pmVar9;
  size_t *psVar10;
  bool bVar11;
  size_t local_110;
  ulong local_e8;
  tchunkptr F_1;
  tchunkptr *C;
  size_t K_1;
  tchunkptr T;
  uint K;
  uint X;
  bindex_t I;
  tbinptr *H_1;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F;
  tchunkptr R;
  tchunkptr XP;
  tchunkptr tp;
  size_t psize;
  mchunkptr p;
  msegmentptr next;
  size_t size;
  char *base;
  msegmentptr sp;
  msegmentptr pred;
  size_t sStack_18;
  int nsegs;
  size_t released;
  mstate m_local;
  
  sStack_18 = 0;
  pred._4_4_ = 0;
  sp = &m->seg;
  base = (char *)(m->seg).next;
  do {
    if (base == (char *)0x0) {
      if (pred._4_4_ < 0x1000) {
        local_110 = 0xfff;
      }
      else {
        local_110 = (size_t)(int)pred._4_4_;
      }
      m->release_checks = local_110;
      return sStack_18;
    }
    __addr = *(void **)base;
    __len = *(size_t *)(base + 8);
    pmVar1 = *(malloc_segment **)(base + 0x10);
    pred._4_4_ = pred._4_4_ + 1;
    if (((*(uint *)(base + 0x18) & 1) != 0) && ((*(uint *)(base + 0x18) & 8) == 0)) {
      if (((long)__addr + 0x10U & 0xf) == 0) {
        local_e8 = 0;
      }
      else {
        local_e8 = 0x10 - ((long)__addr + 0x10U & 0xf) & 0xf;
      }
      pmVar7 = (tbinptr)((long)__addr + local_e8);
      uVar8 = pmVar7->head & 0xfffffffffffffff8;
      if (((pmVar7->head & 3) == 1) &&
         ((long)__addr + (__len - 0x50) <= (long)pmVar7->child + (uVar8 - 0x20))) {
        if (pmVar7 == (tbinptr)m->dv) {
          m->dv = (mchunkptr)0x0;
          m->dvsize = 0;
        }
        else {
          pmVar9 = pmVar7->parent;
          if (pmVar7->bk == pmVar7) {
            CP = pmVar7->child + 1;
            F = pmVar7->child[1];
            if (F == (malloc_tree_chunk *)0x0) {
              CP = pmVar7->child;
              F = pmVar7->child[0];
              if (F == (malloc_tree_chunk *)0x0) goto LAB_0011dcd9;
            }
            while( true ) {
              H = F->child + 1;
              bVar11 = true;
              if (F->child[1] == (malloc_tree_chunk *)0x0) {
                H = F->child;
                bVar11 = F->child[0] != (malloc_tree_chunk *)0x0;
              }
              if (!bVar11) break;
              CP = H;
              F = *H;
            }
            if (CP < m->least_addr) {
              abort();
            }
            *CP = (tchunkptr)0x0;
          }
          else {
            pmVar2 = pmVar7->fd;
            F = pmVar7->bk;
            bVar11 = false;
            if (((malloc_tree_chunk *)m->least_addr <= pmVar2) &&
               (bVar11 = false, pmVar2->bk == pmVar7)) {
              bVar11 = F->fd == pmVar7;
            }
            if (!bVar11) {
              abort();
            }
            pmVar2->bk = F;
            F->fd = pmVar2;
          }
LAB_0011dcd9:
          if (pmVar9 != (malloc_tree_chunk *)0x0) {
            if (pmVar7 == m->treebins[pmVar7->index]) {
              m->treebins[pmVar7->index] = F;
              if (F == (tchunkptr)0x0) {
                m->treemap = (1 << ((byte)pmVar7->index & 0x1f) ^ 0xffffffffU) & m->treemap;
              }
            }
            else {
              if (pmVar9 < (malloc_tree_chunk *)m->least_addr) {
                abort();
              }
              if (pmVar9->child[0] == pmVar7) {
                pmVar9->child[0] = F;
              }
              else {
                pmVar9->child[1] = F;
              }
            }
            if (F != (tchunkptr)0x0) {
              if (F < (tchunkptr)m->least_addr) {
                abort();
              }
              F->parent = pmVar9;
              pmVar9 = pmVar7->child[0];
              if (pmVar9 != (malloc_tree_chunk *)0x0) {
                if (pmVar9 < (malloc_tree_chunk *)m->least_addr) {
                  abort();
                }
                F->child[0] = pmVar9;
                pmVar9->parent = F;
              }
              pmVar9 = pmVar7->child[1];
              if (pmVar9 != (malloc_tree_chunk *)0x0) {
                if (pmVar9 < (malloc_tree_chunk *)m->least_addr) {
                  abort();
                }
                F->child[1] = pmVar9;
                pmVar9->parent = F;
              }
            }
          }
        }
        iVar5 = munmap(__addr,__len);
        if (iVar5 == 0) {
          sStack_18 = __len + sStack_18;
          m->footprint = m->footprint - __len;
          base = (char *)sp;
          sp->next = pmVar1;
        }
        else {
          uVar6 = (uint)(uVar8 >> 8);
          if (uVar6 == 0) {
            K = 0;
          }
          else if (uVar6 < 0x10000) {
            uVar3 = 0x1f;
            if (uVar6 != 0) {
              for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
              }
            }
            iVar5 = 0x1f - (uVar3 ^ 0x1f);
            K = iVar5 * 2 + ((uint)(uVar8 >> ((char)iVar5 + 7U & 0x3f)) & 1);
          }
          else {
            K = 0x1f;
          }
          pmVar9 = (malloc_tree_chunk *)(m->treebins + K);
          pmVar7->index = K;
          pmVar7->child[1] = (malloc_tree_chunk *)0x0;
          pmVar7->child[0] = (malloc_tree_chunk *)0x0;
          if ((m->treemap & 1 << ((byte)K & 0x1f)) == 0) {
            m->treemap = 1 << ((byte)K & 0x1f) | m->treemap;
            pmVar9->prev_foot = (size_t)pmVar7;
            pmVar7->parent = pmVar9;
            pmVar7->bk = pmVar7;
            pmVar7->fd = pmVar7;
          }
          else {
            K_1 = pmVar9->prev_foot;
            if (K == 0x1f) {
              bVar4 = 0;
            }
            else {
              bVar4 = 0x3f - ((char)(K >> 1) + '\x06');
            }
            C = (tchunkptr *)(uVar8 << (bVar4 & 0x3f));
            while ((*(ulong *)(K_1 + 8) & 0xfffffffffffffff8) != uVar8) {
              psVar10 = (size_t *)(K_1 + 0x20 + ((long)C >> 0x3f) * -8);
              C = (tchunkptr *)((long)C << 1);
              if (*psVar10 == 0) {
                if (psVar10 < m->least_addr) {
                  abort();
                }
                *psVar10 = (size_t)pmVar7;
                pmVar7->parent = (malloc_tree_chunk *)K_1;
                pmVar7->bk = pmVar7;
                pmVar7->fd = pmVar7;
                goto LAB_0011e1f6;
              }
              K_1 = *psVar10;
            }
            pmVar9 = *(malloc_tree_chunk **)(K_1 + 0x10);
            bVar11 = false;
            if (m->least_addr <= K_1) {
              bVar11 = (malloc_tree_chunk *)m->least_addr <= pmVar9;
            }
            if (!bVar11) {
              abort();
            }
            pmVar9->bk = pmVar7;
            *(tbinptr *)(K_1 + 0x10) = pmVar7;
            pmVar7->fd = pmVar9;
            pmVar7->bk = (malloc_tree_chunk *)K_1;
            pmVar7->parent = (malloc_tree_chunk *)0x0;
          }
        }
      }
    }
LAB_0011e1f6:
    sp = (msegmentptr)base;
    base = (char *)pmVar1;
  } while( true );
}

Assistant:

static size_t release_unused_segments(mstate m) {
  size_t released = 0;
  int nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char* base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    ++nsegs;
    if (is_mmapped_segment(sp) && !is_extern_segment(sp)) {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!is_inuse(p) && (char*)p + psize >= base + size - TOP_FOOT_SIZE) {
        tchunkptr tp = (tchunkptr)p;
        assert(segment_holds(sp, (char*)sp));
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        else {
          unlink_large_chunk(m, tp);
        }
        if (CALL_MUNMAP(base, size) == 0) {
          released += size;
          m->footprint -= size;
          /* unlink obsoleted record */
          sp = pred;
          sp->next = next;
        }
        else { /* back out if cannot unmap */
          insert_large_chunk(m, tp, psize);
        }
      }
    }
    if (NO_SEGMENT_TRAVERSAL) /* scan only first segment */
      break;
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = (((size_t) nsegs > (size_t) MAX_RELEASE_CHECK_RATE)?
                       (size_t) nsegs : (size_t) MAX_RELEASE_CHECK_RATE);
  return released;
}